

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O3

void deserialize_run_container_incorrect_cardinality_still_allowed(void)

{
  uint8_t data [15];
  undefined7 local_10;
  undefined1 uStack_9;
  undefined7 uStack_8;
  
  uStack_8 = 0x80000000100;
  local_10 = 0x10000303b;
  uStack_9 = 0;
  valid_deserialize_test(&local_10,0xf);
  return;
}

Assistant:

DEFINE_TEST(deserialize_run_container_incorrect_cardinality_still_allowed) {
    // clang-format off
    const uint8_t data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0x01,       // Run Flag Bitset (single container is a run)
        0, 0,       // Upper 16 bits of the first container
        0, 0,       // Cardinality - 1 of the first container
        1, 0,       // First Container - Number of runs
        0, 0,       // First run start
        8, 0,       // First run length - 1 (9 items, but cardinality is 1)
    };
    // clang-format on

    // The cardinality doesn't match the actual number of items in the run,
    // but the implementation ignores the cardinality field.
    valid_deserialize_test(data, sizeof(data));
}